

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElementType::IfcTransportElementType
          (IfcTransportElementType *this)

{
  *(undefined ***)&this->field_0x1b0 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1b8 = 0;
  *(char **)&this->field_0x1c0 = "IfcTransportElementType";
  IfcElementType::IfcElementType(&this->super_IfcElementType,&PTR_construction_vtable_24__00809210);
  *(undefined8 *)&(this->super_IfcElementType).field_0x188 = 0;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject = 0x809108;
  *(undefined8 *)&this->field_0x1b0 = 0x8091f8;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x88 =
       0x809130;
  (this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x809158;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 =
       0x809180;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x148 = 0x8091a8;
  *(undefined8 *)&(this->super_IfcElementType).field_0x180 = 0x8091d0;
  *(undefined1 **)&(this->super_IfcElementType).field_0x190 = &this->field_0x1a0;
  *(undefined8 *)&this->field_0x198 = 0;
  this->field_0x1a0 = 0;
  return;
}

Assistant:

IfcTransportElementType() : Object("IfcTransportElementType") {}